

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

ClippedEdge * __thiscall MutableS2ShapeIndex::EdgeAllocator::NewClippedEdge(EdgeAllocator *this)

{
  size_type sVar1;
  size_type sVar2;
  ClippedEdge *this_00;
  reference this_01;
  pointer pCVar3;
  ClippedEdge *local_18;
  EdgeAllocator *local_10;
  EdgeAllocator *this_local;
  
  sVar1 = this->size_;
  local_10 = this;
  sVar2 = std::
          vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
          ::size(&this->clipped_edges_);
  if (sVar1 == sVar2) {
    this_00 = (ClippedEdge *)operator_new(0x28);
    ClippedEdge::ClippedEdge(this_00);
    local_18 = this_00;
    std::
    vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
    ::emplace_back<MutableS2ShapeIndex::ClippedEdge*>
              ((vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
                *)&this->clipped_edges_,&local_18);
  }
  sVar1 = this->size_;
  this->size_ = sVar1 + 1;
  this_01 = std::
            vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
            ::operator[](&this->clipped_edges_,sVar1);
  pCVar3 = std::
           unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
           ::get(this_01);
  return pCVar3;
}

Assistant:

ClippedEdge* NewClippedEdge() {
    if (size_ == clipped_edges_.size()) {
      clipped_edges_.emplace_back(new ClippedEdge);
    }
    return clipped_edges_[size_++].get();
  }